

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<google::protobuf::(anonymous_namespace)::DynamicMessageTest_Proto3_Test>::
CreateTest(ParameterizedTestFactory<google::protobuf::(anonymous_namespace)::DynamicMessageTest_Proto3_Test>
           *this)

{
  Test *this_00;
  ParameterizedTestFactory<google::protobuf::(anonymous_namespace)::DynamicMessageTest_Proto3_Test>
  *this_local;
  
  WithParamInterface<std::tuple<bool,_bool>_>::SetParam(&this->parameter_);
  this_00 = (Test *)operator_new(0x130);
  google::protobuf::anon_unknown_0::DynamicMessageTest_Proto3_Test::DynamicMessageTest_Proto3_Test
            ((DynamicMessageTest_Proto3_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }